

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_add_settings
              (nghttp2_session *session,uint8_t flags,nghttp2_settings_entry *iv,size_t niv)

{
  nghttp2_mem *mem;
  nghttp2_inflight_settings *pnVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  nghttp2_outbound_item *item;
  nghttp2_settings_entry *iv_00;
  nghttp2_inflight_settings *settings;
  nghttp2_settings_entry *pnVar5;
  nghttp2_inflight_settings *pnVar6;
  size_t sVar7;
  byte bVar8;
  
  bVar8 = session->pending_no_rfc7540_priorities;
  if ((flags & 1) != 0) {
    if (niv != 0) {
      return -0x1f5;
    }
    if (session->max_outbound_ack <= session->obq_flood_counter_) {
      return -0x388;
    }
  }
  iVar3 = nghttp2_iv_check(iv,niv);
  if (iVar3 == 0) {
    return -0x1f5;
  }
  if (niv != 0) {
    sVar4 = 0;
    do {
      if (iv[sVar4].settings_id == 9) {
        if (bVar8 == 0xff) {
          bVar8 = (byte)iv[sVar4].value;
        }
        else if (iv[sVar4].value != (uint)bVar8) {
          return -0x1f5;
        }
      }
      sVar4 = sVar4 + 1;
    } while (niv != sVar4);
  }
  mem = &session->mem;
  item = (nghttp2_outbound_item *)nghttp2_mem_malloc(mem,0x98);
  iVar3 = -0x385;
  if (item == (nghttp2_outbound_item *)0x0) {
    return -0x385;
  }
  if (niv == 0) {
    iv_00 = (nghttp2_settings_entry *)0x0;
  }
  else {
    iv_00 = nghttp2_frame_iv_copy(iv,niv,mem);
    if (iv_00 == (nghttp2_settings_entry *)0x0) goto LAB_00573c2d;
  }
  if ((flags & 1) == 0) {
    settings = (nghttp2_inflight_settings *)nghttp2_mem_malloc(mem,0x18);
    iVar3 = -0x385;
    if (settings == (nghttp2_inflight_settings *)0x0) {
LAB_00573b5c:
      bVar2 = false;
    }
    else {
      if (niv == 0) {
        settings->iv = (nghttp2_settings_entry *)0x0;
      }
      else {
        pnVar5 = nghttp2_frame_iv_copy(iv,niv,mem);
        settings->iv = pnVar5;
        if (pnVar5 == (nghttp2_settings_entry *)0x0) {
          nghttp2_mem_free(mem,settings);
          goto LAB_00573b5c;
        }
      }
      settings->niv = niv;
      settings->next = (nghttp2_inflight_settings *)0x0;
      iVar3 = 0;
      bVar2 = true;
    }
    if (!bVar2) {
      nghttp2_mem_free(mem,iv_00);
      goto LAB_00573c2d;
    }
  }
  else {
    settings = (nghttp2_inflight_settings *)0x0;
  }
  nghttp2_outbound_item_init(item);
  nghttp2_frame_settings_init((nghttp2_settings *)item,flags,iv_00,niv);
  iVar3 = nghttp2_session_add_item(session,item);
  if (iVar3 == 0) {
    if ((flags & 1) == 0) {
      pnVar1 = (nghttp2_inflight_settings *)&session->inflight_settings_head;
      do {
        pnVar6 = pnVar1;
        pnVar1 = pnVar6->next;
      } while (pnVar1 != (nghttp2_inflight_settings *)0x0);
      pnVar6->next = settings;
    }
    else {
      session->obq_flood_counter_ = session->obq_flood_counter_ + 1;
    }
    sVar4 = niv;
    if (niv != 0) {
      do {
        sVar7 = niv;
        if (iv[sVar4 - 1].settings_id == 3) {
          session->pending_local_max_concurrent_stream = iv[sVar4 - 1].value;
          break;
        }
        sVar4 = sVar4 - 1;
      } while (sVar4 != 0);
      do {
        if (iv[sVar7 - 1].settings_id == 2) {
          session->pending_enable_push = (uint8_t)iv[sVar7 - 1].value;
          break;
        }
        sVar7 = sVar7 - 1;
      } while (sVar7 != 0);
      do {
        if (iv[niv - 1].settings_id == 8) {
          session->pending_enable_connect_protocol = (uint8_t)iv[niv - 1].value;
          break;
        }
        niv = niv - 1;
      } while (niv != 0);
    }
    if (bVar8 == 0xff) {
      bVar8 = 0;
    }
    session->pending_no_rfc7540_priorities = bVar8;
    return 0;
  }
  if (-0x385 < iVar3) {
    __assert_fail("nghttp2_is_fatal(rv)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                  ,0x1dde,
                  "int nghttp2_session_add_settings(nghttp2_session *, uint8_t, const nghttp2_settings_entry *, size_t)"
                 );
  }
  inflight_settings_del(settings,mem);
  nghttp2_frame_settings_free((nghttp2_settings *)item,mem);
LAB_00573c2d:
  nghttp2_mem_free(mem,item);
  return iVar3;
}

Assistant:

int nghttp2_session_add_settings(nghttp2_session *session, uint8_t flags,
                                 const nghttp2_settings_entry *iv, size_t niv) {
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_settings_entry *iv_copy;
  size_t i;
  int rv;
  nghttp2_mem *mem;
  nghttp2_inflight_settings *inflight_settings = NULL;
  uint8_t no_rfc7540_pri = session->pending_no_rfc7540_priorities;

  mem = &session->mem;

  if (flags & NGHTTP2_FLAG_ACK) {
    if (niv != 0) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }

    if (session->obq_flood_counter_ >= session->max_outbound_ack) {
      return NGHTTP2_ERR_FLOODED;
    }
  }

  if (!nghttp2_iv_check(iv, niv)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  for (i = 0; i < niv; ++i) {
    if (iv[i].settings_id != NGHTTP2_SETTINGS_NO_RFC7540_PRIORITIES) {
      continue;
    }

    if (no_rfc7540_pri == UINT8_MAX) {
      no_rfc7540_pri = (uint8_t)iv[i].value;
      continue;
    }

    if (iv[i].value != (uint32_t)no_rfc7540_pri) {
      return NGHTTP2_ERR_INVALID_ARGUMENT;
    }
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  if (niv > 0) {
    iv_copy = nghttp2_frame_iv_copy(iv, niv, mem);
    if (iv_copy == NULL) {
      nghttp2_mem_free(mem, item);
      return NGHTTP2_ERR_NOMEM;
    }
  } else {
    iv_copy = NULL;
  }

  if ((flags & NGHTTP2_FLAG_ACK) == 0) {
    rv = inflight_settings_new(&inflight_settings, iv, niv, mem);
    if (rv != 0) {
      assert(nghttp2_is_fatal(rv));
      nghttp2_mem_free(mem, iv_copy);
      nghttp2_mem_free(mem, item);
      return rv;
    }
  }

  nghttp2_outbound_item_init(item);

  frame = &item->frame;

  nghttp2_frame_settings_init(&frame->settings, flags, iv_copy, niv);
  rv = nghttp2_session_add_item(session, item);
  if (rv != 0) {
    /* The only expected error is fatal one */
    assert(nghttp2_is_fatal(rv));

    inflight_settings_del(inflight_settings, mem);

    nghttp2_frame_settings_free(&frame->settings, mem);
    nghttp2_mem_free(mem, item);

    return rv;
  }

  if (flags & NGHTTP2_FLAG_ACK) {
    ++session->obq_flood_counter_;
  } else {
    session_append_inflight_settings(session, inflight_settings);
  }

  /* Extract NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS and ENABLE_PUSH
     here.  We use it to refuse the incoming stream and PUSH_PROMISE
     with RST_STREAM. */

  for (i = niv; i > 0; --i) {
    if (iv[i - 1].settings_id == NGHTTP2_SETTINGS_MAX_CONCURRENT_STREAMS) {
      session->pending_local_max_concurrent_stream = iv[i - 1].value;
      break;
    }
  }

  for (i = niv; i > 0; --i) {
    if (iv[i - 1].settings_id == NGHTTP2_SETTINGS_ENABLE_PUSH) {
      session->pending_enable_push = (uint8_t)iv[i - 1].value;
      break;
    }
  }

  for (i = niv; i > 0; --i) {
    if (iv[i - 1].settings_id == NGHTTP2_SETTINGS_ENABLE_CONNECT_PROTOCOL) {
      session->pending_enable_connect_protocol = (uint8_t)iv[i - 1].value;
      break;
    }
  }

  if (no_rfc7540_pri == UINT8_MAX) {
    session->pending_no_rfc7540_priorities = 0;
  } else {
    session->pending_no_rfc7540_priorities = no_rfc7540_pri;
  }

  return 0;
}